

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatBase.h
# Opt level: O0

TPZBndCondT<double> *
TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>::CreateBCImpl<>
          (TPZMaterial *reference,int id,int type,TPZFMatrix<double> *val1,TPZVec<double> *val2)

{
  void *pvVar1;
  TPZMaterial *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_R8;
  undefined8 local_40;
  TPZVec<double> *in_stack_ffffffffffffffd0;
  TPZFMatrix<double> *in_stack_ffffffffffffffd8;
  
  pvVar1 = operator_new(0x1b0);
  TPZBndCondBase<double,_TPZMatSingleSpaceBC<double>,_TPZMatInterfaceSingleSpaceBC<double>_>::
  TPZBndCondBase((TPZBndCondBase<double,_TPZMatSingleSpaceBC<double>,_TPZMatInterfaceSingleSpaceBC<double>_>
                  *)CONCAT44(in_ESI,in_EDX),in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8,
                 in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  local_40 = (TPZBndCondT<double> *)0x0;
  if (pvVar1 != (void *)0x0) {
    local_40 = (TPZBndCondT<double> *)((long)pvVar1 + 0x40);
  }
  return local_40;
}

Assistant:

TPZBndCondT<TVar> *
TPZMatBase<TVar, Interfaces...>::CreateBCImpl(TPZMaterial *reference, int id, int type, const TPZFMatrix<TVar> &val1,
                                              const TPZVec<TVar> &val2) {
    return new TPZBndCondBase<TVar, typename Interfaces::TInterfaceBC...,
            typename AddInterfaces::TInterfaceBC...>(reference, id, type, val1, val2);
}